

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.h
# Opt level: O2

void __thiscall glslang::TParseContextBase::~TParseContextBase(TParseContextBase *this)

{
  code *pcVar1;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

virtual ~TParseContextBase() { }